

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

optional<pbrt::LightLiSample> * __thiscall
pbrt::DiffuseAreaLight::SampleLi
          (optional<pbrt::LightLiSample> *__return_storage_ptr__,DiffuseAreaLight *this,
          LightSampleContext ctx,Point2f u,SampledWavelengths lambda,LightSamplingMode mode)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  float fVar4;
  float fVar5;
  Point2f uv;
  LightSampleContext LVar6;
  ulong uVar7;
  float fVar8;
  float fVar11;
  undefined1 auVar12 [56];
  undefined1 auVar14 [56];
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  Point3f p;
  Normal3f n;
  Vector3f w;
  SampledSpectrum SVar19;
  ShapeSampleContext shapeCtx;
  undefined8 local_e8;
  undefined8 uStack_e0;
  aligned_storage_t<sizeof(pbrt::ShapeSample),_alignof(pbrt::ShapeSample)> local_d8;
  char local_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  ShapeSampleContext local_58;
  undefined1 auVar10 [64];
  undefined1 auVar9 [16];
  undefined1 auVar13 [64];
  
  LVar6 = ctx;
  local_58.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x =
       ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x;
  local_58.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y =
       ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y;
  local_58.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z =
       ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
  local_58.n.super_Tuple3<pbrt::Normal3,_float>.x = ctx.n.super_Tuple3<pbrt::Normal3,_float>.x;
  local_58.n.super_Tuple3<pbrt::Normal3,_float>.y = ctx.n.super_Tuple3<pbrt::Normal3,_float>.y;
  local_58.n.super_Tuple3<pbrt::Normal3,_float>.z = ctx.n.super_Tuple3<pbrt::Normal3,_float>.z;
  local_58.ns.super_Tuple3<pbrt::Normal3,_float>.x = ctx.ns.super_Tuple3<pbrt::Normal3,_float>.x;
  local_58.ns.super_Tuple3<pbrt::Normal3,_float>.y = ctx.ns.super_Tuple3<pbrt::Normal3,_float>.y;
  local_58.ns.super_Tuple3<pbrt::Normal3,_float>.z = ctx.ns.super_Tuple3<pbrt::Normal3,_float>.z;
  local_58.time = 0.0;
  ShapeHandle::Sample((optional<pbrt::ShapeSample> *)&local_d8.__align,&this->shape,&local_58,u);
  if ((local_80 == '\x01') && (((float)local_d8._80_4_ != 0.0 || (NAN((float)local_d8._80_4_))))) {
    auVar2._4_4_ = local_d8._4_4_;
    auVar2._0_4_ = local_d8._0_4_;
    auVar2._8_4_ = local_d8._8_4_;
    auVar2._12_4_ = local_d8._12_4_;
    auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_d8._12_4_),0x10);
    auVar3 = vinsertps_avx(LVar6.pi.super_Point3<pbrt::Interval>.
                           super_Tuple3<pbrt::Point3,_pbrt::Interval>._0_16_,
                           ZEXT416((uint)ctx.pi.super_Point3<pbrt::Interval>.
                                         super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),0x10);
    fVar8 = ((float)local_d8._4_4_ + auVar2._0_4_) * 0.5;
    fVar11 = ((float)local_d8._8_4_ + auVar2._4_4_) * 0.5;
    auVar9 = CONCAT412((auVar2._12_4_ + 0.0) * 0.5,
                       CONCAT48((auVar2._8_4_ + 0.0) * 0.5,CONCAT44(fVar11,fVar8)));
    auVar16._0_4_ =
         (LVar6.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high +
         auVar3._0_4_) * 0.5;
    auVar16._4_4_ =
         (LVar6.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low +
         auVar3._4_4_) * 0.5;
    auVar16._8_4_ = (auVar3._8_4_ + 0.0) * 0.5;
    auVar16._12_4_ = (auVar3._12_4_ + 0.0) * 0.5;
    auVar3 = vsubps_avx(auVar9,auVar16);
    auVar17._0_4_ = auVar3._0_4_ * auVar3._0_4_;
    auVar17._4_4_ = auVar3._4_4_ * auVar3._4_4_;
    auVar17._8_4_ = auVar3._8_4_ * auVar3._8_4_;
    auVar17._12_4_ = auVar3._12_4_ * auVar3._12_4_;
    fVar4 = ((float)local_d8._16_4_ + (float)local_d8._20_4_) * 0.5;
    auVar2 = vhaddps_avx(auVar17,auVar17);
    fVar5 = fVar4 - (ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.
                     z.low + ctx.pi.super_Point3<pbrt::Interval>.
                             super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5;
    fVar15 = auVar2._0_4_ + fVar5 * fVar5;
    if ((fVar15 != 0.0) || (NAN(fVar15))) {
      auVar2 = vsqrtss_avx(ZEXT416((uint)fVar15),ZEXT416((uint)fVar15));
      local_d8._64_8_ = &(this->super_LightBase).mediumInterface;
      fVar15 = auVar2._0_4_;
      auVar18._4_4_ = fVar15;
      auVar18._0_4_ = fVar15;
      auVar18._8_4_ = fVar15;
      auVar18._12_4_ = fVar15;
      local_78 = ZEXT416((uint)(fVar5 / fVar15));
      uv.super_Tuple2<pbrt::Point2,_float>.y = (float)local_d8._56_4_;
      uv.super_Tuple2<pbrt::Point2,_float>.x = (float)local_d8._52_4_;
      local_68 = vdivps_avx(auVar3,auVar18);
      w.super_Tuple3<pbrt::Vector3,_float>._0_8_ = local_68._0_8_ ^ 0x8000000080000000;
      w.super_Tuple3<pbrt::Vector3,_float>.z = -(fVar5 / fVar15);
      p.super_Tuple3<pbrt::Point3,_float>.z = fVar4;
      p.super_Tuple3<pbrt::Point3,_float>.x = fVar8;
      p.super_Tuple3<pbrt::Point3,_float>.y = fVar11;
      auVar14 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
      auVar12 = ZEXT856(auVar9._8_8_);
      n.super_Tuple3<pbrt::Normal3,_float>.z = (float)local_d8._48_4_;
      n.super_Tuple3<pbrt::Normal3,_float>.x = (float)local_d8._40_4_;
      n.super_Tuple3<pbrt::Normal3,_float>.y = (float)local_d8._44_4_;
      SVar19 = L(this,p,n,uv,w,&lambda);
      auVar13._0_8_ = SVar19.values.values._8_8_;
      auVar13._8_56_ = auVar14;
      auVar10._0_8_ = SVar19.values.values._0_8_;
      auVar10._8_56_ = auVar12;
      auVar2 = vmovlhps_avx(auVar10._0_16_,auVar13._0_16_);
      if ((SVar19.values.values[0] == 0.0) && (!NAN(SVar19.values.values[0]))) {
        uVar7 = 0xffffffffffffffff;
        do {
          if (uVar7 == 2) goto LAB_002f7658;
          fVar15 = *(float *)((long)&uStack_e0 + uVar7 * 4);
          uVar7 = uVar7 + 1;
        } while ((fVar15 == 0.0) && (!NAN(fVar15)));
        if (2 < uVar7) goto LAB_002f7658;
      }
      if (local_80 != '\0') {
        local_e8 = auVar2._0_8_;
        uStack_e0 = auVar2._8_8_;
        (__return_storage_ptr__->optionalValue).__align = local_e8;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = uStack_e0;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = local_d8._64_8_;
        *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x20) =
             CONCAT44(local_d8._4_4_,local_d8._0_4_);
        *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x28) =
             CONCAT44(local_d8._12_4_,local_d8._8_4_);
        *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x30) =
             CONCAT44(local_d8._20_4_,local_d8._16_4_);
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = local_d8._24_8_;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = local_d8._32_8_;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = local_d8._40_8_;
        *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x50) =
             CONCAT44(local_d8._52_4_,local_d8._48_4_);
        *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x58) =
             CONCAT44(local_d8._60_4_,local_d8._56_4_);
        __return_storage_ptr__->set = true;
        uVar1 = vmovlps_avx(local_68);
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = uVar1;
        *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = local_78._0_4_;
        *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = local_d8._80_4_;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = local_d8._72_8_;
        return __return_storage_ptr__;
      }
      LogFatal<char_const(&)[4]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                 ,0xea,"Check failed: %s",(char (*) [4])0x280907c);
    }
  }
LAB_002f7658:
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
  *(undefined8 *)&__return_storage_ptr__->set = 0;
  (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<LightLiSample> DiffuseAreaLight::SampleLi(LightSampleContext ctx,
                                                         Point2f u,
                                                         SampledWavelengths lambda,
                                                         LightSamplingMode mode) const {
    // Sample point on shape for _DiffuseAreaLight_
    ShapeSampleContext shapeCtx(ctx.pi, ctx.n, ctx.ns, 0 /* time */);
    pstd::optional<ShapeSample> ss = shape.Sample(shapeCtx, u);
    if (!ss || ss->pdf == 0 || LengthSquared(ss->intr.p() - ctx.p()) == 0)
        return {};
    DCHECK(!IsNaN(ss->pdf));
    ss->intr.mediumInterface = &mediumInterface;

    // Return _LightLiSample_ for sampled point on shape
    Vector3f wi = Normalize(ss->intr.p() - ctx.p());
    SampledSpectrum Le = L(ss->intr.p(), ss->intr.n, ss->intr.uv, -wi, lambda);
    if (!Le)
        return {};
    return LightLiSample(Le, wi, ss->pdf, ss->intr);
}